

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O1

uint __thiscall llvm::ARM::parseHWDiv(ARM *this,StringRef HWDiv)

{
  uint uVar1;
  char *__n;
  int iVar2;
  char *pcVar3;
  long lVar4;
  bool bVar5;
  
  pcVar3 = HWDiv.Data;
  if (pcVar3 == (char *)0x9) {
    bVar5 = this[8] == (ARM)0x6d && *(long *)this == 0x72612c626d756874;
  }
  else {
    bVar5 = false;
  }
  if (bVar5) {
    pcVar3 = (char *)0x9;
    this = (ARM *)"arm,thumb";
  }
  lVar4 = 0;
  while( true ) {
    __n = *(char **)((long)&DAT_00206278 + lVar4);
    uVar1 = *(uint *)((long)&DAT_00206280 + lVar4);
    if (pcVar3 == __n) {
      if (__n == (char *)0x0) {
        bVar5 = true;
      }
      else {
        iVar2 = bcmp(this,*(void **)((long)&(anonymous_namespace)::HWDivNames + lVar4),(size_t)__n);
        bVar5 = iVar2 == 0;
      }
    }
    else {
      bVar5 = false;
    }
    if (bVar5) break;
    lVar4 = lVar4 + 0x18;
    if (lVar4 == 0x78) {
      return 0;
    }
  }
  return uVar1;
}

Assistant:

unsigned llvm::ARM::parseHWDiv(StringRef HWDiv) {
  StringRef Syn = getHWDivSynonym(HWDiv);
  for (const auto D : HWDivNames) {
    if (Syn == D.getName())
      return D.ID;
  }
  return ARM::AEK_INVALID;
}